

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O0

QStringList * __thiscall
QNetworkAccessFileBackendFactory::supportedSchemes(QNetworkAccessFileBackendFactory *this)

{
  DataPointer *in_RDI;
  long in_FS_OFFSET;
  QStringList *schemes;
  char16_t *str;
  char16_t *str_1;
  DataPointer *this_00;
  QArrayDataPointer<char16_t> local_68 [2];
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->d = (Data *)0xaaaaaaaaaaaaaaaa;
  in_RDI->ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  in_RDI->size = -0x5555555555555556;
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x197d3c);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_38,(Data *)0x0,L"file",4);
  QString::QString((QString *)this_00,in_RDI);
  QList<QString>::operator<<((QList<QString> *)this_00,(rvalue_ref)in_RDI);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_68,(Data *)0x0,L"qrc",3);
  QString::QString((QString *)this_00,in_RDI);
  QList<QString>::operator<<((QList<QString> *)this_00,(rvalue_ref)in_RDI);
  QString::~QString((QString *)0x197e06);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  QString::~QString((QString *)0x197e1d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QNetworkAccessFileBackendFactory::supportedSchemes() const
{
    QStringList schemes;
    schemes << QStringLiteral("file")
            << QStringLiteral("qrc");
#if defined(Q_OS_ANDROID)
    schemes << QStringLiteral("assets");
#endif
    return schemes;
}